

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::posit_sprite
          (Base<(TI::TMS::Personality)3> *this,int sprite_number,int sprite_position,
          uint8_t screen_row)

{
  uint8_t uVar1;
  byte bVar2;
  ActiveSprite *pAVar3;
  ActiveSprite *sprite;
  uint8_t sprite_row;
  uint8_t screen_row_local;
  int sprite_position_local;
  int sprite_number_local;
  Base<(TI::TMS::Personality)3> *this_local;
  
  if (sprite_number == 0) {
    advance(this,&this->fetch_sprite_buffer_);
    this->fetched_sprites_ = this->fetch_sprite_buffer_;
    SpriteBuffer::reset_sprite_collection(this->fetch_sprite_buffer_);
    uVar1 = anon_struct_32_7_cb3853ac_for_mode_timing_::sprite_terminator
                      (&this->mode_timing_,this->fetch_line_buffer_->screen_mode);
    this->fetch_sprite_buffer_->sprite_terminator = uVar1;
    this->fetch_sprite_buffer_->is_filling = true;
  }
  if ((this->status_ & 0x40) == 0) {
    this->status_ = this->status_ & 0xe0 | (byte)sprite_number & 0x1f;
  }
  if ((this->fetch_sprite_buffer_->sprites_stopped & 1U) == 0) {
    if ((((this->mode_timing_).allow_sprite_terminator & 1U) == 0) ||
       (sprite_position != (uint)this->fetch_sprite_buffer_->sprite_terminator)) {
      bVar2 = screen_row - (char)sprite_position;
      if (bVar2 < this->sprite_height_) {
        if (this->fetch_sprite_buffer_->active_sprite_slot ==
            (this->mode_timing_).maximum_visible_sprites) {
          this->status_ = this->status_ | 0x40;
        }
        else {
          pAVar3 = this->fetch_sprite_buffer_->active_sprites +
                   this->fetch_sprite_buffer_->active_sprite_slot;
          pAVar3->index = sprite_number;
          pAVar3->row = (int)(uint)bVar2 >> ((this->sprites_magnified_ & 1U) != 0);
          this->fetch_sprite_buffer_->active_sprite_slot =
               this->fetch_sprite_buffer_->active_sprite_slot + 1;
        }
      }
    }
    else {
      this->fetch_sprite_buffer_->sprites_stopped = true;
    }
  }
  return;
}

Assistant:

void Base<personality>::posit_sprite(int sprite_number, int sprite_position, uint8_t screen_row) {
	// Evaluation of visibility of sprite 0 is always the first step in
	// populating a sprite buffer; so use it to uncork a new one.
	if(!sprite_number) {
		advance(fetch_sprite_buffer_);
		fetched_sprites_ = &*fetch_sprite_buffer_;
		fetch_sprite_buffer_->reset_sprite_collection();
		fetch_sprite_buffer_->sprite_terminator = mode_timing_.sprite_terminator(fetch_line_buffer_->screen_mode);

		if constexpr (SpriteBuffer::test_is_filling) {
			fetch_sprite_buffer_->is_filling = true;
		}
	}

	if(!(status_ & StatusSpriteOverflow)) {
		status_ = uint8_t((status_ & ~0x1f) | (sprite_number & 0x1f));
	}
	if(fetch_sprite_buffer_->sprites_stopped) return;

	// A sprite Y of 208 means "don't scan the list any further".
	if(mode_timing_.allow_sprite_terminator && sprite_position == fetch_sprite_buffer_->sprite_terminator) {
		fetch_sprite_buffer_->sprites_stopped = true;
		return;
	}

	const auto sprite_row = uint8_t(screen_row - sprite_position);
	if(sprite_row < 0 || sprite_row >= sprite_height_) return;

	if(fetch_sprite_buffer_->active_sprite_slot == mode_timing_.maximum_visible_sprites) {
		status_ |= StatusSpriteOverflow;
		return;
	}

	auto &sprite = fetch_sprite_buffer_->active_sprites[fetch_sprite_buffer_->active_sprite_slot];
	sprite.index = sprite_number;
	sprite.row = sprite_row >> (sprites_magnified_ ? 1 : 0);
	++fetch_sprite_buffer_->active_sprite_slot;
}